

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

int32_t __thiscall
icu_63::Calendar::getActualMaximum(Calendar *this,UCalendarDateFields field,UErrorCode *status)

{
  int iVar1;
  int endValue;
  int32_t iVar2;
  Calendar *this_00;
  undefined4 extraout_var_00;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined4 extraout_var;
  
  if (UCAL_MILLISECONDS_IN_DAY < field) {
LAB_001e9895:
    iVar1 = (*(this->super_UObject)._vptr_UObject[0x14])(this,field);
    endValue = (*(this->super_UObject)._vptr_UObject[0x10])(this,field);
    iVar2 = getActualHelper(this,field,iVar1,endValue,status);
    return iVar2;
  }
  if ((0x35fe80U >> (field & (UCAL_DST_OFFSET|UCAL_ZONE_OFFSET)) & 1) != 0) {
    iVar1 = (*(this->super_UObject)._vptr_UObject[0x10])(this,field);
    return iVar1;
  }
  if (field == UCAL_DATE) {
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar1 = (*(this->super_UObject)._vptr_UObject[3])(this);
      this_00 = (Calendar *)CONCAT44(extraout_var_00,iVar1);
      if (this_00 != (Calendar *)0x0) {
        this_00->fLenient = '\x01';
        uVar4 = 0;
        (*(this_00->super_UObject)._vptr_UObject[0x1e])(this_00,5,0,status);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          complete(this_00,status);
          if (U_ZERO_ERROR < *status) goto LAB_001e9872;
          uVar5 = (ulong)(uint)this_00->fFields[0x13];
          complete(this_00,status);
          if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
            uVar4 = (ulong)(uint)this_00->fFields[2];
          }
        }
        else {
LAB_001e9872:
          uVar5 = 0;
        }
        iVar1 = (*(this->super_UObject)._vptr_UObject[0x22])(this,uVar5,uVar4);
        goto LAB_001e9886;
      }
LAB_001e98ce:
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
LAB_001e98d5:
    iVar1 = 0;
  }
  else {
    if (field != UCAL_DAY_OF_YEAR) goto LAB_001e9895;
    if (U_ZERO_ERROR < *status) goto LAB_001e98d5;
    iVar1 = (*(this->super_UObject)._vptr_UObject[3])(this);
    this_00 = (Calendar *)CONCAT44(extraout_var,iVar1);
    if (this_00 == (Calendar *)0x0) goto LAB_001e98ce;
    this_00->fLenient = '\x01';
    uVar3 = 0;
    (*(this_00->super_UObject)._vptr_UObject[0x1e])(this_00,6,0,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      complete(this_00,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        uVar3 = this_00->fFields[0x13];
      }
    }
    iVar1 = (*(this->super_UObject)._vptr_UObject[0x23])(this,(ulong)uVar3);
LAB_001e9886:
    (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
  }
  return iVar1;
}

Assistant:

int32_t
Calendar::getActualMaximum(UCalendarDateFields field, UErrorCode& status) const
{
    int32_t result;
    switch (field) {
    case UCAL_DATE:
        {
            if(U_FAILURE(status)) return 0;
            Calendar *cal = clone();
            if(!cal) { status = U_MEMORY_ALLOCATION_ERROR; return 0; }
            cal->setLenient(TRUE);
            cal->prepareGetActual(field,FALSE,status);
            result = handleGetMonthLength(cal->get(UCAL_EXTENDED_YEAR, status), cal->get(UCAL_MONTH, status));
            delete cal;
        }
        break;

    case UCAL_DAY_OF_YEAR:
        {
            if(U_FAILURE(status)) return 0;
            Calendar *cal = clone();
            if(!cal) { status = U_MEMORY_ALLOCATION_ERROR; return 0; }
            cal->setLenient(TRUE);
            cal->prepareGetActual(field,FALSE,status);
            result = handleGetYearLength(cal->get(UCAL_EXTENDED_YEAR, status));
            delete cal;
        }
        break;

    case UCAL_DAY_OF_WEEK:
    case UCAL_AM_PM:
    case UCAL_HOUR:
    case UCAL_HOUR_OF_DAY:
    case UCAL_MINUTE:
    case UCAL_SECOND:
    case UCAL_MILLISECOND:
    case UCAL_ZONE_OFFSET:
    case UCAL_DST_OFFSET:
    case UCAL_DOW_LOCAL:
    case UCAL_JULIAN_DAY:
    case UCAL_MILLISECONDS_IN_DAY:
        // These fields all have fixed minima/maxima
        result = getMaximum(field);
        break;

    default:
        // For all other fields, do it the hard way....
        result = getActualHelper(field, getLeastMaximum(field), getMaximum(field),status);
        break;
    }
    return result;
}